

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O3

string * cmGlobalGenerator::EscapeJSON(string *__return_storage_ptr__,string *s)

{
  byte bVar1;
  size_type sVar2;
  pointer pcVar3;
  size_type sVar4;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  sVar2 = s->_M_string_length;
  if (sVar2 != 0) {
    pcVar3 = (s->_M_dataplus)._M_p;
    sVar4 = 0;
    do {
      bVar1 = pcVar3[sVar4];
      if (bVar1 < 0x22) {
        if ((bVar1 != 9) && (bVar1 != 10)) goto LAB_0031d632;
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      else {
        if ((bVar1 == 0x5c) || (bVar1 == 0x22)) {
          std::__cxx11::string::push_back((char)__return_storage_ptr__);
        }
LAB_0031d632:
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
      }
      sVar4 = sVar4 + 1;
    } while (sVar2 != sVar4);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmGlobalGenerator::EscapeJSON(const std::string& s)
{
  std::string result;
  result.reserve(s.size());
  for (char i : s) {
    switch (i) {
      case '"':
      case '\\':
        result += '\\';
        result += i;
        break;
      case '\n':
        result += "\\n";
        break;
      case '\t':
        result += "\\t";
        break;
      default:
        result += i;
    }
  }
  return result;
}